

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufGrow(xmlBufPtr buf,int len)

{
  size_t sVar1;
  uint uVar2;
  
  uVar2 = 0xffffffff;
  if (-1 < len && buf != (xmlBufPtr)0x0) {
    if (len == 0) {
      uVar2 = 0;
    }
    else {
      sVar1 = xmlBufGrowInternal(buf,(ulong)(uint)len);
      uVar2 = -(uint)(buf->error != 0) | (uint)sVar1;
    }
  }
  return uVar2;
}

Assistant:

int
xmlBufGrow(xmlBufPtr buf, int len) {
    size_t ret;

    if ((buf == NULL) || (len < 0)) return(-1);
    if (len == 0)
        return(0);
    ret = xmlBufGrowInternal(buf, len);
    if (buf->error != 0)
        return(-1);
    return((int) ret);
}